

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

int main(int argc,char **argv)

{
  ACUTEST_CMDLINE_OPTION_ *pAVar1;
  acutest_test_ *test;
  bool bVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  FILE *__s;
  int iVar5;
  int iVar6;
  int iVar7;
  acutest_state_ aVar8;
  __pid_t __pid;
  ACUTEST_CMDLINE_OPTION_ *pAVar9;
  char *pcVar10;
  ssize_t sVar11;
  char *pcVar12;
  uint *puVar13;
  acutest_test_data_ *paVar14;
  char *pcVar15;
  char cVar16;
  int n_7;
  ulong uVar17;
  int n;
  uint uVar18;
  size_t sVar19;
  timespec *ptVar20;
  int n_6;
  ulong uVar21;
  int n_8;
  long lVar22;
  int n_5;
  uint uVar23;
  int n_4;
  ACUTEST_CMDLINE_OPTION_ *pAVar24;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auStack_278 [8];
  acutest_timer_type_ end;
  undefined8 local_99;
  __time_t _Stack_91;
  long local_78;
  undefined1 local_70 [8];
  acutest_timer_type_ start;
  int exit_code;
  long lVar26;
  
  acutest_argv0_ = *argv;
  acutest_colorize_ = isatty(1);
  acutest_list_size_ = 1;
  acutest_test_data_ = (acutest_test_data_ *)calloc(0x12,0x10);
  if (acutest_test_data_ == (acutest_test_data_ *)0x0) {
    main_cold_1();
  }
  if (1 < argc) {
    iVar5 = 1;
    bVar2 = false;
LAB_0010aace:
    pcVar12 = argv[iVar5];
    if (bVar2) {
LAB_0010aba7:
      iVar6 = acutest_cmdline_callback_(0,pcVar12);
LAB_0010abae:
      if (iVar6 == 0) goto LAB_0010abba;
      goto LAB_0010ad9b;
    }
    if (*pcVar12 != '-') {
      bVar2 = false;
      goto LAB_0010aba7;
    }
    cVar16 = pcVar12[1];
    if (cVar16 == '\0') goto LAB_0010aba7;
    if ((cVar16 != '-') || (pcVar12[2] != '\0')) {
      pcVar10 = pcVar12 + 2;
      iVar6 = 0x58;
      pAVar24 = acutest_cmdline_options_;
      local_78 = (long)iVar5;
      do {
        pcVar15 = pAVar24->longname;
        if (pcVar15 == (char *)0x0 || cVar16 != '-') {
          if (cVar16 == pAVar24->shortname) {
            if ((pAVar24->flags & 2) == 0) {
              iVar6 = acutest_cmdline_callback_(iVar6,(char *)0x0);
              if (iVar6 != 0) goto LAB_0010ad9b;
              pcVar12 = argv[local_78];
              cVar16 = pcVar12[2];
              bVar2 = false;
              if (cVar16 == '\0') goto LAB_0010abba;
              lVar22 = 0;
              goto LAB_0010ac08;
            }
            if (*pcVar10 == '\0') {
              iVar7 = iVar5 + 1;
              if (iVar7 < argc) {
                iVar6 = acutest_cmdline_callback_(iVar6,argv[iVar7]);
                iVar5 = iVar7;
                goto LAB_0010ad92;
              }
LAB_0010ad4b:
              iVar6 = -0x7ffffffe;
              pcVar10 = pcVar12;
            }
LAB_0010ad54:
            iVar6 = acutest_cmdline_callback_(iVar6,pcVar10);
LAB_0010ad92:
            bVar2 = false;
            goto LAB_0010abae;
          }
        }
        else {
          sVar19 = strlen(pcVar15);
          iVar7 = strncmp(pcVar10,pcVar15,sVar19);
          if (iVar7 == 0) {
            if (pcVar10[sVar19] == '=') {
              if ((pAVar24->flags & 3) != 0) {
                pcVar10 = pcVar10 + sVar19 + 1;
                goto LAB_0010ad54;
              }
              pcVar12 = auStack_278;
              snprintf(pcVar12,0x21,"--%s",pcVar15);
              iVar6 = -0x7ffffffd;
            }
            else {
              if (pcVar10[sVar19] != '\0') goto LAB_0010ab7c;
              if ((pAVar24->flags & 2) != 0) goto LAB_0010ad4b;
              pcVar12 = (char *)0x0;
            }
            iVar6 = acutest_cmdline_callback_(iVar6,pcVar12);
            goto LAB_0010ad92;
          }
        }
LAB_0010ab7c:
        iVar6 = pAVar24[1].id;
        pAVar24 = pAVar24 + 1;
      } while (iVar6 != 0);
      if ((cVar16 == '-') && (pcVar10 = strchr(pcVar12,0x3d), pcVar10 != (char *)0x0)) {
        sVar19 = (long)pcVar10 - (long)pcVar12;
        if (0x1f < sVar19) {
          sVar19 = 0x20;
        }
        strncpy(auStack_278,pcVar12,sVar19);
        auStack_278[sVar19] = 0;
        pcVar12 = auStack_278;
      }
      iVar6 = acutest_cmdline_callback_(-0x7fffffff,pcVar12);
      bVar2 = false;
      goto LAB_0010abae;
    }
    bVar2 = true;
    goto LAB_0010abba;
  }
LAB_0010ad9b:
  bVar4 = acutest_exclude_mode_;
  paVar14 = acutest_test_data_;
  auVar3 = _DAT_0013e030;
  if (acutest_timer_ - 1U < 2) {
    acutest_timer_id_ = acutest_timer_;
  }
  lVar22 = 0;
  iVar5 = 0;
  do {
    iVar5 = iVar5 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar22) == -3);
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x120);
  if (iVar5 == 0) {
    lVar22 = 0x30;
    auVar25 = _DAT_0013e010;
    auVar27 = _DAT_0013e020;
    do {
      auVar28 = auVar27 ^ auVar3;
      if (auVar28._4_4_ == -0x80000000 && auVar28._0_4_ < -0x7fffffee) {
        *(undefined4 *)((long)&paVar14[-3].state + lVar22) = 0xfffffffe;
        *(undefined4 *)((long)&paVar14[-2].state + lVar22) = 0xfffffffe;
      }
      auVar28 = auVar25 ^ auVar3;
      if (auVar28._4_4_ == -0x80000000 && auVar28._0_4_ < -0x7fffffee) {
        *(undefined4 *)((long)&paVar14[-1].state + lVar22) = 0xfffffffe;
        *(undefined4 *)((long)&paVar14->state + lVar22) = 0xfffffffe;
      }
      lVar26 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar26 + 4;
      lVar26 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 4;
      auVar25._8_8_ = lVar26 + 4;
      lVar22 = lVar22 + 0x40;
    } while (lVar22 != 0x170);
  }
  else {
    lVar22 = 0;
    do {
      *(uint *)((long)&paVar14->state + lVar22) =
           ~(uint)(*(int *)((long)&paVar14->state + lVar22) == -3 ^ bVar4) | 0xfffffffe;
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
  }
  iVar5 = acutest_no_exec_;
  if (acutest_no_exec_ < 0) {
    lVar22 = 0;
    uVar18 = 0;
    do {
      uVar18 = uVar18 + (*(int *)((long)&paVar14->state + lVar22) == -2);
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
    iVar5 = 1;
    if (1 < uVar18) {
      auStack_278[0] = 10;
      iVar6 = open("/proc/self/status",0);
      iVar5 = 0;
      if (iVar6 != -1) {
        uVar21 = 1;
LAB_0010af57:
        uVar17 = uVar21;
        if (uVar17 < 0x1ff) goto code_r0x0010af63;
        goto LAB_0010af87;
      }
    }
  }
  goto LAB_0010b00b;
  while( true ) {
    cVar16 = pcVar12[lVar22 + 3];
    lVar22 = lVar22 + 1;
    if (cVar16 == '\0') break;
LAB_0010ac08:
    iVar6 = 0x58;
    pAVar24 = acutest_cmdline_options_;
    if (cVar16 != 'X') {
      pAVar9 = acutest_cmdline_options_;
      do {
        iVar6 = pAVar9[1].id;
        if (iVar6 == 0) {
          iVar7 = -0x7fffffff;
          goto LAB_0010ac47;
        }
        pAVar24 = pAVar9 + 1;
        pAVar1 = pAVar9 + 1;
        pAVar9 = pAVar24;
      } while (cVar16 != pAVar1->shortname);
    }
    iVar7 = -0x7ffffffe;
    if ((pAVar24->flags & 2) == 0) {
      pcVar10 = (char *)0x0;
      iVar7 = iVar6;
    }
    else {
LAB_0010ac47:
      local_70[0] = '-';
      local_70[2] = 0;
      pcVar10 = local_70;
      local_70[1] = cVar16;
    }
    iVar6 = acutest_cmdline_callback_(iVar7,pcVar10);
    if (iVar6 != 0) goto LAB_0010ad9b;
  }
LAB_0010abba:
  iVar5 = iVar5 + 1;
  if (argc <= iVar5) goto LAB_0010ad9b;
  goto LAB_0010aace;
code_r0x0010af63:
  sVar11 = read(iVar6,auStack_278 + uVar17,0x1ff - uVar17);
  uVar21 = sVar11 + uVar17;
  if (0 < sVar11) goto LAB_0010af57;
LAB_0010af87:
  auStack_278[uVar17] = 0;
  pcVar12 = strstr(auStack_278,"\nTracerPid:");
  if (pcVar12 != (char *)0x0 && pcVar12 < (char *)((long)&local_99 + 1U)) {
    iVar7 = atoi(pcVar12 + 0xb);
    close(iVar6);
    iVar5 = 0;
    if (iVar7 != 0) {
      iVar5 = 1;
    }
    goto LAB_0010b00b;
  }
  if (uVar17 == 0x1ff) {
    auStack_278 = (undefined1  [8])local_99;
    end.tv_sec = _Stack_91;
    uVar21 = 0x20;
    goto LAB_0010af57;
  }
  close(iVar6);
  iVar5 = 0;
LAB_0010b00b:
  acutest_no_exec_ = iVar5;
  if (acutest_tap_ == '\x01') {
    if (2 < acutest_verbose_level_) {
      acutest_verbose_level_ = 2;
    }
    acutest_no_summary_ = 1;
    if (acutest_worker_ == '\0') {
      lVar22 = 0;
      do {
        lVar22 = lVar22 + 0x10;
      } while (lVar22 != 0x120);
      printf("1..%d\n");
    }
  }
  lVar22 = 0;
  paVar14 = acutest_test_data_;
  iVar5 = acutest_worker_index_;
  do {
    if (*(int *)((long)&paVar14->state + lVar22) == -2) {
      test = (acutest_test_ *)((long)&acutest_list_[0].name + lVar22);
      acutest_test_already_logged_ = 0;
      acutest_current_test_ = test;
      clock_gettime(acutest_timer_id_,(timespec *)local_70);
      if (acutest_no_exec_ == 0) {
        fflush(_stdout);
        fflush(_stderr);
        __pid = fork();
        if (__pid == -1) {
          puVar13 = (uint *)__errno_location();
          pcVar12 = strerror(*puVar13);
          acutest_error_("Cannot fork. %s [%d]",pcVar12,(ulong)*puVar13);
        }
        else {
          if (__pid == 0) {
            acutest_worker_ = 1;
            aVar8 = acutest_do_run_(test,iVar5);
            acutest_exit_(aVar8);
          }
          waitpid(__pid,(int *)((long)&start.tv_nsec + 4),0);
          uVar18 = start.tv_nsec._4_4_ & 0x7f;
          if (uVar18 == 0) {
            aVar8 = start.tv_nsec._4_4_ >> 8 & 0xff;
            goto LAB_0010b1b9;
          }
          if ((int)(uVar18 * 0x1000000 + 0x1000000) < 0x2000000) {
            acutest_error_("Test ended in an unexpected way [%d].",(ulong)start.tv_nsec._4_4_);
          }
          else {
            if ((uVar18 < 0x10) && ((0x452fU >> ((uint)((ulong)uVar18 - 1) & 0x1f) & 1) != 0)) {
              ptVar20 = (timespec *)
                        (&DAT_0013e12c + *(int *)(&DAT_0013e12c + ((ulong)uVar18 - 1) * 4));
            }
            else {
              snprintf((char *)auStack_278,0x20,"signal %d");
              ptVar20 = (timespec *)auStack_278;
            }
            acutest_error_("Test interrupted by %s.",ptVar20);
          }
        }
        aVar8 = ACUTEST_STATE_FAILED;
      }
      else {
        aVar8 = acutest_do_run_(test,iVar5);
      }
LAB_0010b1b9:
      iVar5 = iVar5 + 1;
      clock_gettime(acutest_timer_id_,(timespec *)auStack_278);
      paVar14 = acutest_test_data_;
      acutest_current_test_ = (acutest_test_ *)0x0;
      *(acutest_state_ *)((long)&acutest_test_data_->state + lVar22) = aVar8;
      *(double *)((long)&paVar14->duration + lVar22) =
           (double)(end.tv_sec - start.tv_sec) / 1000000000.0 +
           (double)((long)auStack_278 -
                   CONCAT53(local_70._3_5_,CONCAT12(local_70[2],CONCAT11(local_70[1],local_70[0]))))
      ;
    }
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x120);
  if (0 < acutest_verbose_level_ && (acutest_no_summary_ & 1) == 0) {
    lVar22 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (uint)(*(int *)((long)&paVar14->state + lVar22) == -1);
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
    lVar22 = 0;
    uVar18 = 0;
    do {
      uVar18 = uVar18 + (*(int *)((long)&paVar14->state + lVar22) == 0);
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
    lVar22 = 0;
    uVar23 = 0;
    do {
      uVar23 = uVar23 + (*(int *)((long)&paVar14->state + lVar22) == 1);
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
    if (2 < acutest_verbose_level_) {
      acutest_colored_printf_(10,"Summary:\n");
      printf("  Count of run unit tests:        %4d\n",(ulong)(0x12U - iVar5));
      printf("  Count of successful unit tests: %4d\n",(ulong)uVar18);
      printf("  Count of failed unit tests:     %4d\n",(ulong)uVar23);
    }
    if (uVar23 == 0) {
      acutest_colored_printf_(0xc,"SUCCESS:");
      puts(" No unit tests have failed.");
    }
    else {
      acutest_colored_printf_(0xb,"FAILED:");
      printf(" %d of %d unit tests %s failed.\n",(ulong)uVar23,(ulong)(0x12U - iVar5));
    }
    if (2 < acutest_verbose_level_) {
      putchar(10);
    }
  }
  __s = acutest_xml_output_;
  if (acutest_xml_output_ != (FILE *)0x0) {
    pcVar12 = *argv;
    pcVar15 = strrchr(pcVar12,0x2f);
    pcVar10 = pcVar15 + 1;
    if (pcVar15 == (char *)0x0) {
      pcVar10 = pcVar12;
    }
    fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)__s);
    lVar22 = 0;
    uVar21 = 0;
    do {
      uVar21 = (ulong)((int)uVar21 +
                      (uint)(*(int *)((long)&acutest_test_data_->state + lVar22) == 1));
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
    lVar22 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar22) == 2);
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
    lVar22 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar22) == -1);
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
    fprintf((FILE *)acutest_xml_output_,
            "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            pcVar10,0x12,uVar21,(ulong)(uint)(iVar6 + iVar5));
    lVar22 = 0;
    do {
      paVar14 = acutest_test_data_;
      fprintf((FILE *)acutest_xml_output_,"  <testcase name=\"%s\" time=\"%.2f\">\n",
              *(undefined8 *)((long)&acutest_test_data_->duration + lVar22),
              *(undefined8 *)((long)&acutest_list_[0].name + lVar22));
      iVar5 = *(int *)((long)&paVar14->state + lVar22);
      pcVar12 = "<skipped />";
      if (iVar5 == -1) {
LAB_0010b48f:
        fprintf((FILE *)acutest_xml_output_,"    %s\n",pcVar12);
      }
      else if (iVar5 != 0) {
        pcVar12 = "<skipped />";
        if (iVar5 != 2) {
          pcVar12 = "<failure />";
        }
        goto LAB_0010b48f;
      }
      fwrite("  </testcase>\n",0xe,1,(FILE *)acutest_xml_output_);
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
    fwrite("</testsuite>\n",0xd,1,(FILE *)acutest_xml_output_);
    fclose((FILE *)acutest_xml_output_);
  }
  if (acutest_worker_ == '\x01') {
    lVar22 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar22) == -1);
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0x120);
    if (iVar5 == 0x11) {
      lVar22 = 0;
      do {
        uVar18 = *(uint *)((long)&acutest_test_data_->state + lVar22);
        if (uVar18 != 0xffffffff) goto LAB_0010b566;
        lVar22 = lVar22 + 0x10;
      } while (lVar22 != 0x120);
      uVar18 = 1;
      goto LAB_0010b566;
    }
  }
  lVar22 = 0;
  iVar5 = 0;
  do {
    iVar5 = iVar5 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar22) == 1);
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x120);
  uVar18 = (uint)(iVar5 != 0);
LAB_0010b566:
  free(acutest_test_data_);
  return uVar18;
}

Assistant:

int
main(int argc, char** argv)
{
    int i, index;
    int exit_code = 1;

    acutest_argv0_ = argv[0];

#if defined ACUTEST_UNIX_
    acutest_colorize_ = isatty(STDOUT_FILENO);
#elif defined ACUTEST_WIN_
 #if defined _BORLANDC_
    acutest_colorize_ = isatty(_fileno(stdout));
 #else
    acutest_colorize_ = _isatty(_fileno(stdout));
 #endif
#else
    acutest_colorize_ = 0;
#endif

    /* Count all test units */
    acutest_list_size_ = 0;
    for(i = 0; acutest_list_[i].func != NULL; i++)
        acutest_list_size_++;

    acutest_test_data_ = (struct acutest_test_data_*)calloc(acutest_list_size_, sizeof(struct acutest_test_data_));
    if(acutest_test_data_ == NULL) {
        fprintf(stderr, "Out of memory.\n");
        acutest_exit_(2);
    }

    /* Parse options */
    acutest_cmdline_read_(acutest_cmdline_options_, argc, argv, acutest_cmdline_callback_);

    /* Initialize the proper timer. */
    acutest_timer_init_();

#if defined(ACUTEST_WIN_)
    SetUnhandledExceptionFilter(acutest_seh_exception_filter_);
#ifdef _MSC_VER
    _set_abort_behavior(0, _WRITE_ABORT_MSG);
#endif
#endif

    /* Determine what to run. */
    if(acutest_count_(ACUTEST_STATE_SELECTED) > 0) {
        enum acutest_state_ if_selected;
        enum acutest_state_ if_unselected;

        if(!acutest_exclude_mode_) {
            if_selected = ACUTEST_STATE_NEEDTORUN;
            if_unselected = ACUTEST_STATE_EXCLUDED;
        } else {
            if_selected = ACUTEST_STATE_EXCLUDED;
            if_unselected = ACUTEST_STATE_NEEDTORUN;
        }

        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state == ACUTEST_STATE_SELECTED)
                acutest_test_data_[i].state = if_selected;
            else
                acutest_test_data_[i].state = if_unselected;
        }
    } else {
        /* By default, we want to run all tests. */
        for(i = 0; acutest_list_[i].func != NULL; i++)
            acutest_test_data_[i].state = ACUTEST_STATE_NEEDTORUN;
    }

    /* By default, we want to suppress running tests as child processes if we
     * run just one test, or if we're under debugger: Debugging tests is then
     * so much easier. */
    if(acutest_no_exec_ < 0) {
        if(acutest_count_(ACUTEST_STATE_NEEDTORUN) <= 1  ||  acutest_under_debugger_())
            acutest_no_exec_ = 1;
        else
            acutest_no_exec_ = 0;
    }

    if(acutest_tap_) {
        /* TAP requires we know test result ("ok", "not ok") before we output
         * anything about the test, and this gets problematic for larger verbose
         * levels. */
        if(acutest_verbose_level_ > 2)
            acutest_verbose_level_ = 2;

        /* TAP harness should provide some summary. */
        acutest_no_summary_ = 1;

        if(!acutest_worker_)
            printf("1..%d\n", acutest_count_(ACUTEST_STATE_NEEDTORUN));
    }

    index = acutest_worker_index_;
    for(i = 0; acutest_list_[i].func != NULL; i++) {
        if(acutest_test_data_[i].state == ACUTEST_STATE_NEEDTORUN)
            acutest_run_(&acutest_list_[i], index++, i);
    }

    /* Write a summary */
    if(!acutest_no_summary_ && acutest_verbose_level_ >= 1) {
        int n_run, n_success, n_failed ;

        n_run = acutest_list_size_ - acutest_count_(ACUTEST_STATE_EXCLUDED);
        n_success = acutest_count_(ACUTEST_STATE_SUCCESS);
        n_failed = acutest_count_(ACUTEST_STATE_FAILED);

        if(acutest_verbose_level_ >= 3) {
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Summary:\n");

            printf("  Count of run unit tests:        %4d\n", n_run);
            printf("  Count of successful unit tests: %4d\n", n_success);
            printf("  Count of failed unit tests:     %4d\n", n_failed);
        }

        if(n_failed == 0) {
            acutest_colored_printf_(ACUTEST_COLOR_GREEN_INTENSIVE_, "SUCCESS:");
            printf(" No unit tests have failed.\n");
        } else {
            acutest_colored_printf_(ACUTEST_COLOR_RED_INTENSIVE_, "FAILED:");
            printf(" %d of %d unit tests %s failed.\n",
                    n_failed, n_run, (n_failed == 1) ? "has" : "have");
        }

        if(acutest_verbose_level_ >= 3)
            printf("\n");
    }

    if (acutest_xml_output_) {
        const char* suite_name = acutest_basename_(argv[0]);
        fprintf(acutest_xml_output_, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
        fprintf(acutest_xml_output_, "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            suite_name,
            (int)acutest_list_size_,
            acutest_count_(ACUTEST_STATE_FAILED),
            acutest_count_(ACUTEST_STATE_SKIPPED) + acutest_count_(ACUTEST_STATE_EXCLUDED));
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            struct acutest_test_data_ *details = &acutest_test_data_[i];
            const char* str_state;
            fprintf(acutest_xml_output_, "  <testcase name=\"%s\" time=\"%.2f\">\n", acutest_list_[i].name, details->duration);

            switch(details->state) {
                case ACUTEST_STATE_SUCCESS:     str_state = NULL; break;
                case ACUTEST_STATE_EXCLUDED:    /* Fall through. */
                case ACUTEST_STATE_SKIPPED:     str_state = "<skipped />"; break;
                case ACUTEST_STATE_FAILED:      /* Fall through. */
                default:                        str_state = "<failure />"; break;
            }

            if(str_state != NULL)
                fprintf(acutest_xml_output_, "    %s\n", str_state);
            fprintf(acutest_xml_output_, "  </testcase>\n");
        }
        fprintf(acutest_xml_output_, "</testsuite>\n");
        fclose(acutest_xml_output_);
    }

    if(acutest_worker_  &&  acutest_count_(ACUTEST_STATE_EXCLUDED)+1 == acutest_list_size_) {
        /* If we are the child process, we need to propagate the test state
         * without any moderation. */
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state != ACUTEST_STATE_EXCLUDED) {
                exit_code = (int) acutest_test_data_[i].state;
                break;
            }
        }
    } else {
        if(acutest_count_(ACUTEST_STATE_FAILED) > 0)
            exit_code = 1;
        else
            exit_code = 0;
    }

    acutest_cleanup_();
    return exit_code;
}